

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

bool __thiscall wasm::Type::isStruct(Type *this)

{
  int iVar1;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    getHeapType(this);
    iVar1 = wasm::HeapType::getKind();
    return iVar1 == 2;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }